

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

int Gia_ManBmcPerformInt(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  sat_solver *psVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  Bmc_Mna_t *p;
  Gia_Man_t *pGVar13;
  Gia_Man_t *pGVar14;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Abc_Cex_t *pAVar16;
  uint uVar17;
  int extraout_EDX;
  int extraout_EDX_00;
  long lVar18;
  long lVar19;
  abctime aVar20;
  Gia_Obj_t *pGVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  double dVar25;
  int Lit;
  timespec ts;
  
  Lit = 1;
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar18 = 1;
  }
  else {
    lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  p = Bmc_MnaAlloc();
  psVar5 = p->pSat;
  iVar7 = pPars->nTimeOut;
  if ((long)iVar7 == 0) {
    aVar20 = 0;
  }
  else {
    iVar8 = clock_gettime(3,(timespec *)&ts);
    if (iVar8 < 0) {
      lVar19 = -1;
    }
    else {
      lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    aVar20 = lVar19 + (long)iVar7 * 1000000;
  }
  psVar5->nRuntimeLimit = aVar20;
  pGVar13 = Gia_ManBmcUnroll(pGia,pPars->nFramesMax,pPars->nFramesAdd,pPars->fVeryVerbose,&p->vPiMap
                            );
  p->pFrames = pGVar13;
  uVar9 = (pGVar13->vCos->nSize - pGVar13->nRegs) / (pGia->vCos->nSize - pGia->nRegs);
  if (pPars->fVerbose != 0) {
    uVar10 = Gia_ManBmcFindFirst(pGVar13);
    printf("Unfolding for %d frames with first non-trivial PO %d.  ",(ulong)uVar9,(ulong)uVar10);
    iVar8 = 3;
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar19 = -1;
    }
    else {
      lVar19 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    Abc_Print(iVar8,"%s =","Time");
    Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar19 + lVar18) / 1000000.0);
  }
  if (pPars->fUseSynth == 0) {
    if (pPars->fVerbose != 0) {
      Gia_ManPrintStats(p->pFrames,(Gps_Par_t *)0x0);
    }
  }
  else {
    pGVar13 = p->pFrames;
    pGVar14 = Gia_ManAigSyn2(pGVar13,1,0,0,0,0,pPars->fVerbose,0);
    p->pFrames = pGVar14;
    Gia_ManStop(pGVar13);
  }
  if (pPars->fDumpFrames != 0) {
    Gia_AigerWrite(p->pFrames,"frames.aig",0,0,0);
    puts("Dumped unfolded frames into file \"frames.aig\".");
  }
  if (pPars->fUseOldCnf == 0) {
    pCVar15 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p->pFrames,pPars->nLutSize,1,0,0,pPars->fVerbose);
    iVar7 = extraout_EDX_00;
  }
  else {
    pAig = Gia_ManToAigSimple(p->pFrames);
    pCVar15 = Cnf_DeriveOther(pAig,1);
    Aig_ManStop(pAig);
    iVar7 = extraout_EDX;
  }
  p->pCnf = pCVar15;
  Vec_IntFillExtra(p->vId2Var,p->pFrames->nObjs,iVar7);
  iVar7 = -1;
  if (0 < (int)uVar9) {
    uVar10 = 0;
    do {
      iVar7 = pGia->vCos->nSize - pGia->nRegs;
      uVar1 = uVar10 + 1;
      iVar7 = Gia_ManBmcCheckOutputs(p->pFrames,iVar7 * uVar10,iVar7 * uVar1);
      if (iVar7 == 0) {
        iVar7 = pGia->vCos->nSize - pGia->nRegs;
        Gia_ManBmcAddCnfNew(p,iVar7 * uVar10,iVar7 * uVar1);
        iVar7 = pGia->vCos->nSize - pGia->nRegs;
        uVar22 = iVar7 * uVar10;
        uVar17 = 0xfffffffe;
        if ((int)uVar22 < (int)(iVar7 * uVar1)) {
          uVar24 = (ulong)uVar22;
          do {
            pGVar13 = p->pFrames;
            iVar7 = pGVar13->vCos->nSize;
            if (iVar7 - pGVar13->nRegs <= (int)uVar24) {
              __assert_fail("v < Gia_ManPoNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
            }
            if (((int)uVar22 < 0) || (iVar7 <= (int)uVar24)) {
LAB_00576854:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar7 = pGVar13->vCos->pArray[uVar24];
            lVar18 = (long)iVar7;
            if ((lVar18 < 0) || (pGVar13->nObjs <= iVar7)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar6 = pGVar13->pObjs;
            uVar17 = (uint)*(undefined8 *)(pGVar6 + lVar18);
            pGVar21 = (Gia_Obj_t *)
                      ((ulong)(uVar17 >> 0x1d & 1) ^
                      (ulong)(pGVar6 + lVar18 + -(ulong)(uVar17 & 0x1fffffff)));
            if (pGVar6 != pGVar21) {
              if (((ulong)pGVar21 ^ (ulong)pGVar6) == 1) {
                printf("Output %d is trivially SAT.\n",uVar24 & 0xffffffff);
              }
              else {
                if (p->vId2Var->nSize <= iVar7) goto LAB_00576854;
                iVar7 = p->vId2Var->pArray[lVar18];
                if (iVar7 < 0) {
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                Lit = iVar7 * 2;
                iVar7 = sat_solver_solve(p->pSat,&Lit,(lit *)&ts,(long)pPars->nConfLimit,0,0,0);
                if (iVar7 != -1) {
                  uVar17 = 0;
                  if (iVar7 != 1) {
                    uVar17 = iVar7 == 0 | 0xfffffffe;
                  }
                  goto LAB_0057659e;
                }
              }
            }
            uVar24 = uVar24 + 1;
          } while ((int)uVar24 < (int)((pGia->vCos->nSize - pGia->nRegs) * uVar1));
          uVar17 = 0xfffffffe;
        }
        else {
          uVar24 = (ulong)uVar22;
        }
LAB_0057659e:
        if (pPars->fVerbose != 0) {
          pGVar13 = p->pFrames;
          iVar7 = pGVar13->vCis->nSize;
          iVar8 = pGVar13->nRegs;
          iVar23 = pGVar13->vCos->nSize;
          iVar2 = pGVar13->nObjs;
          iVar3 = p->nSatVars;
          uVar22 = p->vInputs->nSize;
          uVar4 = p->vNodes->nSize;
          iVar11 = sat_solver_nclauses(p->pSat);
          iVar12 = sat_solver_nconflicts(p->pSat);
          dVar25 = Gia_ManMemory(p->pFrames);
          printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
                 ,dVar25 * 9.5367431640625e-07,(ulong)uVar10,(ulong)(uint)(iVar7 - iVar8),
                 (ulong)(uint)(~(iVar7 + iVar23) + iVar2),(ulong)(iVar3 - 1),(ulong)uVar22,
                 (ulong)uVar4,CONCAT44(extraout_var,iVar11),CONCAT44(extraout_var_00,iVar12));
          iVar8 = 3;
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          lVar19 = p->clkStart;
          Abc_Print(iVar8,"%s =","Time");
          Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar18 - lVar19) / 1000000.0);
        }
        if (uVar17 != 0xfffffffe) {
          iVar7 = -1;
          if (uVar17 == 0xffffffff) {
            printf("SAT solver reached conflict/runtime limit in frame %d.\n",(ulong)uVar10);
          }
          else {
            if (pGia->pCexSeq != (Abc_Cex_t *)0x0) {
              free(pGia->pCexSeq);
              pGia->pCexSeq = (Abc_Cex_t *)0x0;
            }
            pAVar16 = Gia_ManBmcCexGen(p,pGia,(int)uVar24);
            pGia->pCexSeq = pAVar16;
            iVar7 = 0;
            printf("Output %d of miter \"%s\" was asserted in frame %d.  ",
                   (ulong)((pGia->nRegs - pGia->vCos->nSize) * uVar10 + (int)uVar24),pGia->pName,
                   (ulong)uVar10);
            iVar23 = 3;
            iVar8 = clock_gettime(3,(timespec *)&ts);
            if (iVar8 < 0) {
              lVar18 = -1;
            }
            else {
              lVar18 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            lVar19 = p->clkStart;
            Abc_Print(iVar23,"%s =","Time");
            Abc_Print(iVar23,"%9.2f sec\n",(double)(lVar18 - lVar19) / 1000000.0);
          }
          goto LAB_00576812;
        }
      }
      pPars->iFrame = uVar10;
      uVar10 = uVar1;
    } while (uVar1 != uVar9);
    iVar7 = -1;
  }
LAB_00576812:
  Gia_ManStop(p->pFrames);
  Bmc_MnaFree(p);
  return iVar7;
}

Assistant:

int Gia_ManBmcPerformInt( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmc_Mna_t * p;
    Gia_Man_t * pTemp;
    int nFramesMax, f, i=0, Lit = 1, status, RetValue = -2;
    abctime clk = Abc_Clock();
    p = Bmc_MnaAlloc();
    sat_solver_set_runtime_limit( p->pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    p->pFrames = Gia_ManBmcUnroll( pGia, pPars->nFramesMax, pPars->nFramesAdd, pPars->fVeryVerbose, &p->vPiMap );
    nFramesMax = Gia_ManPoNum(p->pFrames) / Gia_ManPoNum(pGia);
    if ( pPars->fVerbose )
    {
        printf( "Unfolding for %d frames with first non-trivial PO %d.  ", nFramesMax, Gia_ManBmcFindFirst(p->pFrames) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    if ( pPars->fUseSynth )
    {
        p->pFrames = Gia_ManAigSyn2( pTemp = p->pFrames, 1, 0, 0, 0, 0, pPars->fVerbose, 0 );  Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
        Gia_ManPrintStats( p->pFrames, NULL );
    if ( pPars->fDumpFrames )
    {
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
    }
    if ( pPars->fUseOldCnf )
        p->pCnf = Cnf_DeriveGia( p->pFrames );
    else
    {
//        p->pFrames = Jf_ManDeriveCnf( pTemp = p->pFrames, 1 );  Gia_ManStop( pTemp );
//        p->pCnf = (Cnf_Dat_t *)p->pFrames->pData; p->pFrames->pData = NULL;
        p->pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p->pFrames, pPars->nLutSize, 1, 0, 0, pPars->fVerbose );
    }
    Vec_IntFillExtra( p->vId2Var, Gia_ManObjNum(p->pFrames), 0 );
    // create clauses for constant node
//    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    for ( f = 0; f < nFramesMax; f++ )
    {
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCnfNew( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                if ( Gia_ObjChild0(pObj) == Gia_ManConst1(p->pFrames) )
                {
                    printf( "Output %d is trivially SAT.\n", i );
                    continue;
                }
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True )  // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
            // report statistics
            if ( pPars->fVerbose )
            {
                printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                    f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                    p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                    sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                ABC_FREE( pGia->pCexSeq );
                pGia->pCexSeq = Gia_ManBmcCexGen( p, pGia, i );
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
        pPars->iFrame = f;
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // cleanup
    Gia_ManStop( p->pFrames );
    Bmc_MnaFree( p );
    return RetValue;
}